

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddTime.c
# Opt level: O3

DdNode * Extra_bddAndAbstractTime(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube,int TimeOut)

{
  DdNode *pDVar1;
  int in_R9D;
  
  do {
    manager->reordered = 0;
    pDVar1 = cuddBddAndAbstractRecurTime(manager,f,g,cube,(int *)(ulong)(uint)TimeOut,in_R9D);
  } while (manager->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Extra_bddAndAbstractTime(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube,
  int TimeOut)
{
    DdNode *res;
    int Counter = 0;

    do {
	manager->reordered = 0;
	res = cuddBddAndAbstractRecurTime(manager, f, g, cube, &Counter, TimeOut);
    } while (manager->reordered == 1);
    return(res);

}